

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  char *__haystack;
  undefined8 in_RAX;
  undefined8 uVar1;
  char *pcVar2;
  AssertionResult *pAVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  pointer *__ptr;
  AssertionResult AVar4;
  char *begin_string_quote;
  char *local_58;
  undefined1 local_50 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  
  pcVar2 = *needle;
  __haystack = *haystack;
  local_40 = haystack_expr;
  local_38 = needle_expr;
  if (pcVar2 == (char *)0x0 || __haystack == (char *)0x0) {
    uVar1 = CONCAT71((int7)((ulong)in_RAX >> 8),pcVar2 == __haystack);
  }
  else {
    pcVar2 = strstr(__haystack,pcVar2);
    uVar1 = CONCAT71((int7)((ulong)pcVar2 >> 8),pcVar2 != (char *)0x0);
    needle_expr = (char *)extraout_RDX.
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
  }
  if (SUB81(uVar1,0) == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_58 = "\"";
    local_50[0] = false;
    local_48._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    pAVar3 = AssertionResult::operator<<((AssertionResult *)local_50,(char (*) [11])"Value of: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_38);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x149ee2);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x149774);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,needle);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x14a2da);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x149780);
    local_30 = "not ";
    if (expected_to_be_substring) {
      local_30 = "";
    }
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_30);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"a substring of ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_40);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x149ee2);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x149741);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,haystack);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x14a2f0);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar3);
    uVar1 = extraout_RAX;
    needle_expr = (char *)extraout_RDX_00.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    if (local_48._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48._M_head_impl);
      uVar1 = extraout_RAX_00;
      needle_expr = (char *)extraout_RDX_01.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
    }
  }
  AVar4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )needle_expr;
  AVar4._0_8_ = uVar1;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(bool expected_to_be_substring,
                                const char* needle_expr,
                                const char* haystack_expr,
                                const StringType& needle,
                                const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
         << "Value of: " << needle_expr << "\n"
         << "  Actual: " << begin_string_quote << needle << "\"\n"
         << "Expected: " << (expected_to_be_substring ? "" : "not ")
         << "a substring of " << haystack_expr << "\n"
         << "Which is: " << begin_string_quote << haystack << "\"";
}